

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

string * __thiscall QPDF::getPDFVersion_abi_cxx11_(string *__return_storage_ptr__,QPDF *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             &((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->pdf_version);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::getPDFVersion() const
{
    return m->pdf_version;
}